

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RandomGen.cpp
# Opt level: O1

double __thiscall
RandomGen::rand_exponential(RandomGen *this,double half_life,double t_min,double t_max)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  undefined1 auVar5 [16];
  double dVar6;
  double dVar7;
  
  uVar1 = (this->rng).super_xoroshiro<unsigned_long,_unsigned_long,_24U,_16U,_37U>.s0_;
  uVar2 = (this->rng).super_xoroshiro<unsigned_long,_unsigned_long,_24U,_16U,_37U>.s1_;
  uVar3 = uVar2 ^ uVar1;
  (this->rng).super_xoroshiro<unsigned_long,_unsigned_long,_24U,_16U,_37U>.s0_ =
       uVar3 << 0x10 ^ (uVar1 << 0x18 | uVar1 >> 0x28) ^ uVar3;
  (this->rng).super_xoroshiro<unsigned_long,_unsigned_long,_24U,_16U,_37U>.s1_ =
       uVar3 << 0x25 | uVar3 >> 0x1b;
  dVar7 = 0.0;
  if (0.0 <= t_min) {
    dVar7 = exp((t_min * -0.6931471805599453) / half_life);
    dVar7 = 1.0 - dVar7;
  }
  dVar6 = 1.0;
  if (0.0 <= t_max) {
    dVar6 = exp((t_max * -0.6931471805599453) / half_life);
    dVar6 = 1.0 - dVar6;
  }
  lVar4 = uVar2 + uVar1;
  auVar5._8_4_ = (int)((ulong)lVar4 >> 0x20);
  auVar5._0_8_ = lVar4;
  auVar5._12_4_ = 0x45300000;
  dVar7 = log(1.0 - ((dVar6 - dVar7) *
                     ((auVar5._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0)) *
                     5.421010862427522e-20 + dVar7));
  return (dVar7 * half_life) / -0.6931471805599453;
}

Assistant:

double RandomGen::rand_exponential(double half_life, double t_min,
                                   double t_max) {
  double r = rand_uniform();
  double r_min = 0;
  double r_max = 1;
  if (t_min >= 0) {
    r_min = 1 - exp(-t_min * log2 / half_life);
  }
  if (t_max >= 0) {
    r_max = 1 - exp(-t_max * log2 / half_life);
  }
  r = (r_max - r_min) * r + r_min;
  return -log(1 - r) * half_life / log2;
}